

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_from_run(run_container_t *arr)

{
  uint16_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  int32_t iVar5;
  uint uVar6;
  long lVar7;
  array_container_t *paVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  uVar6 = croaring_hardware_support();
  if ((uVar6 & 2) == 0) {
    uVar6 = croaring_hardware_support();
    if ((uVar6 & 1) == 0) {
      iVar10 = arr->n_runs;
      lVar7 = (long)iVar10;
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          iVar10 = iVar10 + (uint)arr->runs[lVar9].length;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
    }
    else {
      iVar10 = _avx2_run_container_cardinality(arr);
    }
  }
  else {
    iVar10 = _avx512_run_container_cardinality(arr);
  }
  paVar8 = array_container_create_given_capacity(iVar10);
  paVar8->cardinality = 0;
  iVar10 = arr->n_runs;
  if (0 < (long)iVar10) {
    prVar3 = arr->runs;
    puVar4 = paVar8->array;
    lVar7 = 0;
    iVar5 = paVar8->cardinality;
    do {
      iVar12 = iVar5;
      uVar1 = prVar3[lVar7].value;
      uVar2 = prVar3[lVar7].length;
      lVar9 = 0;
      do {
        puVar4[iVar12 + lVar9] = uVar1 + (short)lVar9;
        lVar9 = lVar9 + 1;
        iVar11 = (int)lVar9;
      } while (uVar2 + 1 != iVar11);
      lVar7 = lVar7 + 1;
      iVar5 = iVar12 + iVar11;
    } while (lVar7 != iVar10);
    paVar8->cardinality = iVar12 + iVar11;
  }
  return paVar8;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}